

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,char *name)

{
  uint uVar1;
  Fl_Tree_Item **ppFVar2;
  char *__s1;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->_children)._total;
  ppFVar2 = (this->_children)._items;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    if (uVar5 == uVar4) {
LAB_001d5e14:
      return -(uint)((long)(int)uVar1 <= (long)uVar4);
    }
    __s1 = ppFVar2[uVar4]->_label;
    if (__s1 != (char *)0x0) {
      iVar3 = strcmp(__s1,name);
      if (iVar3 == 0) {
        Fl_Tree_Item_Array::remove(&this->_children,(char *)(uVar4 & 0xffffffff));
        goto LAB_001d5e14;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Fl_Tree_Item::remove_child(const char *name) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t)->label() ) {
      if ( strcmp(child(t)->label(), name) == 0 ) {
        _children.remove(t);
	recalc_tree();		// may change tree geometry
        return(0);
      }
    }
  }
  return(-1);
}